

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# olc_act.c
# Opt level: O0

bool redit_rlist(CHAR_DATA *ch,char *argument)

{
  uint uVar1;
  BUFFER *buffer;
  char *pcVar2;
  long in_RDI;
  int col;
  int vnum;
  bool found;
  char arg [4608];
  BUFFER *buf1;
  char buf [4608];
  AREA_DATA_conflict *pArea;
  ROOM_INDEX_DATA *pRoomIndex;
  CHAR_DATA *in_stack_ffffffffffffdba8;
  char *in_stack_ffffffffffffdbb0;
  uint in_stack_ffffffffffffdbb8;
  int vnum_00;
  uint uVar3;
  uint in_stack_ffffffffffffdbc4;
  BUFFER *in_stack_ffffffffffffdbc8;
  char local_1228 [4608];
  long local_28;
  ROOM_INDEX_DATA *local_20;
  long local_10;
  
  vnum_00 = 0;
  local_10 = in_RDI;
  one_argument(in_stack_ffffffffffffdbb0,(char *)in_stack_ffffffffffffdba8);
  local_28 = *(long *)(*(long *)(local_10 + 0xa8) + 0x30);
  buffer = new_buf();
  in_stack_ffffffffffffdbc4 = in_stack_ffffffffffffdbc4 & 0xffffff;
  uVar1 = (uint)*(short *)(local_28 + 0x58);
  while ((int)uVar1 <= (int)*(short *)(local_28 + 0x5a)) {
    local_20 = get_room_index(vnum_00);
    uVar3 = uVar1;
    if (local_20 != (ROOM_INDEX_DATA *)0x0) {
      in_stack_ffffffffffffdbc4 = CONCAT13(1,(int3)in_stack_ffffffffffffdbc4);
      in_stack_ffffffffffffdbb0 = local_1228;
      pcVar2 = capitalize(local_20->name);
      sprintf(in_stack_ffffffffffffdbb0,"[%5d] %-17.16s",(ulong)uVar1,pcVar2);
      add_buf(in_stack_ffffffffffffdbc8,(char *)CONCAT44(in_stack_ffffffffffffdbc4,uVar3));
      vnum_00 = vnum_00 + 1;
      in_stack_ffffffffffffdbb8 = uVar1;
      if (vnum_00 % 3 == 0) {
        add_buf(in_stack_ffffffffffffdbc8,(char *)CONCAT44(in_stack_ffffffffffffdbc4,uVar3));
        in_stack_ffffffffffffdbb8 = uVar1;
      }
    }
    uVar1 = uVar3 + 1;
  }
  if ((in_stack_ffffffffffffdbc4 & 0x1000000) == 0) {
    send_to_char((char *)CONCAT44(in_stack_ffffffffffffdbc4,uVar1),
                 (CHAR_DATA *)CONCAT44(vnum_00,in_stack_ffffffffffffdbb8));
  }
  else {
    if (vnum_00 % 3 != 0) {
      add_buf(in_stack_ffffffffffffdbc8,(char *)CONCAT44(in_stack_ffffffffffffdbc4,uVar1));
    }
    buf_string(buffer);
    page_to_char(in_stack_ffffffffffffdbb0,in_stack_ffffffffffffdba8);
    free_buf((BUFFER *)0x771d67);
  }
  return false;
}

Assistant:

bool redit_rlist(CHAR_DATA *ch, char *argument)
{
	ROOM_INDEX_DATA *pRoomIndex;
	AREA_DATA *pArea;
	char buf[MAX_STRING_LENGTH];
	BUFFER *buf1;
	char arg[MAX_INPUT_LENGTH];
	bool found;
	int vnum;
	int col = 0;

	one_argument(argument, arg);

	pArea = ch->in_room->area;
	buf1 = new_buf();
	/*    buf1[0] = '\0'; */
	found = false;

	for (vnum = pArea->min_vnum; vnum <= pArea->max_vnum; vnum++)
	{
		pRoomIndex = get_room_index(vnum);
		if (pRoomIndex)
		{
			found = true;

			sprintf(buf, "[%5d] %-17.16s", vnum, capitalize(pRoomIndex->name));
			add_buf(buf1, buf);

			if (++col % 3 == 0)
				add_buf(buf1, "\n\r");
		}
	}

	if (!found)
	{
		send_to_char("Room(s) not found in this area.\n\r", ch);
		return false;
	}

	if (col % 3 != 0)
		add_buf(buf1, "\n\r");

	page_to_char(buf_string(buf1), ch);
	free_buf(buf1);
	return false;
}